

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshio.cpp
# Opt level: O1

CornerData<Vector2> *
geometrycentral::surface::packToParam
          (CornerData<Vector2> *__return_storage_ptr__,SurfaceMesh *mesh,VertexData<double> *vals)

{
  size_t sVar1;
  pointer puVar2;
  pointer puVar3;
  double *pdVar4;
  Vector2 *pVVar5;
  size_t i;
  size_t sVar6;
  size_t sVar7;
  
  MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>::MeshData
            (__return_storage_ptr__,mesh);
  sVar1 = mesh->nHalfedgesFillCount;
  if ((sVar1 == 0) ||
     ((puVar2 = (mesh->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start, *puVar2 != 0xffffffffffffffff &&
      (*(mesh->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start < mesh->nFacesFillCount)))) {
    sVar7 = 0;
  }
  else {
    sVar6 = 1;
    sVar7 = sVar6;
    if (sVar1 != 1) {
      do {
        if ((puVar2[sVar6] != 0xffffffffffffffff) &&
           (sVar7 = sVar6,
           (mesh->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[sVar6] < mesh->nFacesFillCount)) break;
        sVar6 = sVar6 + 1;
        sVar7 = sVar1;
      } while (sVar1 != sVar6);
    }
  }
  if (sVar7 != sVar1) {
    puVar2 = (mesh->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (mesh->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar4 = (vals->data).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    pVVar5 = (__return_storage_ptr__->data).
             super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    do {
      pVVar5[sVar7].x = pdVar4[puVar3[sVar7]];
      pVVar5[sVar7].y = 0.0;
      sVar6 = sVar7 + 1;
      sVar7 = sVar6;
      if (sVar6 != sVar1) {
        do {
          if ((puVar2[sVar6] != 0xffffffffffffffff) &&
             (sVar7 = sVar6,
             (mesh->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[sVar6] < mesh->nFacesFillCount)) break;
          sVar6 = sVar6 + 1;
          sVar7 = sVar1;
        } while (sVar1 != sVar6);
      }
    } while (sVar7 != sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

CornerData<Vector2> packToParam(SurfaceMesh& mesh, VertexData<double>& vals) {
  CornerData<Vector2> out(mesh);
  for (Corner c : mesh.corners()) {
    Vertex v = c.vertex();
    out[c] = Vector2{vals[v], 0.};
  }
  return out;
}